

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

void __thiscall
QPDFJob::getUOPagenos
          (QPDFJob *this,vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *uos,
          map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
          *pagenos)

{
  bool bVar1;
  reference pUVar2;
  size_type sVar3;
  size_type sVar4;
  reference piVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  const_reference pvVar8;
  int local_7c;
  const_iterator cStack_78;
  int to_pageno;
  const_iterator __end2;
  const_iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  size_t repeat_size;
  size_t from_size;
  size_t page_idx;
  UnderOverlay *uo;
  iterator __end1;
  iterator __begin1;
  vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *__range1;
  size_t uo_idx;
  map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
  *pagenos_local;
  vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *uos_local;
  QPDFJob *this_local;
  
  __range1 = (vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *)0x0;
  uo_idx = (size_t)pagenos;
  pagenos_local =
       (map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
        *)uos;
  uos_local = (vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *)this;
  __end1 = std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::begin(uos);
  uo = (UnderOverlay *)
       std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>::end(uos);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
                                     *)&uo), bVar1) {
    pUVar2 = __gnu_cxx::
             __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
             ::operator*(&__end1);
    from_size = 0;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(&pUVar2->from_pagenos);
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&pUVar2->repeat_pagenos);
    __end2 = std::vector<int,_std::allocator<int>_>::begin(&pUVar2->to_pagenos);
    cStack_78 = std::vector<int,_std::allocator<int>_>::end(&pUVar2->to_pagenos);
    while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff88), bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&__end2);
      local_7c = *piVar5;
      if (from_size < sVar3) {
        pmVar6 = std::
                 map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                 ::operator[]((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                               *)uo_idx,&local_7c);
        pmVar7 = std::
                 map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](pmVar6,(key_type_conflict *)&__range1);
        pvVar8 = std::vector<int,_std::allocator<int>_>::at(&pUVar2->from_pagenos,from_size);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar7,pvVar8);
      }
      else if (sVar4 != 0) {
        pmVar6 = std::
                 map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                 ::operator[]((map<int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>_>
                               *)uo_idx,&local_7c);
        pmVar7 = std::
                 map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[](pmVar6,(key_type_conflict *)&__range1);
        pvVar8 = std::vector<int,_std::allocator<int>_>::at
                           (&pUVar2->repeat_pagenos,(from_size - sVar3) % sVar4);
        std::vector<int,_std::allocator<int>_>::push_back(pmVar7,pvVar8);
      }
      from_size = from_size + 1;
      __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&__end2);
    }
    __range1 = (vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *)
               ((long)&(__range1->
                       super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<QPDFJob::UnderOverlay_*,_std::vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void
QPDFJob::getUOPagenos(
    std::vector<QPDFJob::UnderOverlay>& uos,
    std::map<int, std::map<size_t, std::vector<int>>>& pagenos)
{
    size_t uo_idx = 0;
    for (auto const& uo: uos) {
        size_t page_idx = 0;
        size_t from_size = uo.from_pagenos.size();
        size_t repeat_size = uo.repeat_pagenos.size();
        for (int to_pageno: uo.to_pagenos) {
            if (page_idx < from_size) {
                pagenos[to_pageno][uo_idx].push_back(uo.from_pagenos.at(page_idx));
            } else if (repeat_size) {
                pagenos[to_pageno][uo_idx].push_back(
                    uo.repeat_pagenos.at((page_idx - from_size) % repeat_size));
            }
            ++page_idx;
        }
        ++uo_idx;
    }
}